

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O0

LispPTR N_OP_putbaseptrn(LispPTR base,LispPTR tos,int n)

{
  LispPTR *pLVar1;
  int n_local;
  LispPTR tos_local;
  LispPTR base_local;
  
  pLVar1 = NativeAligned4FromLAddr((base & 0xfffffff) + n);
  *pLVar1 = tos & 0xfffffff;
  return base & 0xfffffff;
}

Assistant:

LispPTR N_OP_putbaseptrn(LispPTR base, LispPTR tos, int n) {
  base = POINTERMASK & base;
  *NativeAligned4FromLAddr(base + n) = tos & POINTERMASK;
  return (base);
}